

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_function_selector_ssse3.c
# Opt level: O0

void ihevcd_init_function_ptr_ssse3(void *pv_codec)

{
  codec_t *ps_codec;
  void *pv_codec_local;
  
  *(code **)((long)pv_codec + 0x41a0) = ihevc_deblk_chroma_horz_ssse3;
  *(code **)((long)pv_codec + 0x41a8) = ihevc_deblk_chroma_vert_ssse3;
  *(code **)((long)pv_codec + 0x41b0) = ihevc_deblk_luma_vert_ssse3;
  *(code **)((long)pv_codec + 0x41b8) = ihevc_deblk_luma_horz_ssse3;
  *(code **)((long)pv_codec + 0x41c0) = ihevc_inter_pred_chroma_copy_ssse3;
  *(code **)((long)pv_codec + 0x41c8) = ihevc_inter_pred_chroma_copy_w16out_ssse3;
  *(code **)((long)pv_codec + 0x41d0) = ihevc_inter_pred_chroma_horz_ssse3;
  *(code **)((long)pv_codec + 0x41d8) = ihevc_inter_pred_chroma_horz_w16out_ssse3;
  *(code **)((long)pv_codec + 0x41e0) = ihevc_inter_pred_chroma_vert_ssse3;
  *(code **)((long)pv_codec + 0x41e8) = ihevc_inter_pred_chroma_vert_w16inp_ssse3;
  *(code **)((long)pv_codec + 0x41f0) = ihevc_inter_pred_chroma_vert_w16inp_w16out_ssse3;
  *(code **)((long)pv_codec + 0x41f8) = ihevc_inter_pred_chroma_vert_w16out_ssse3;
  *(code **)((long)pv_codec + 0x4200) = ihevc_inter_pred_luma_horz_ssse3;
  *(code **)((long)pv_codec + 0x4208) = ihevc_inter_pred_luma_vert_ssse3;
  *(code **)((long)pv_codec + 0x4210) = ihevc_inter_pred_luma_vert_w16out_ssse3;
  *(code **)((long)pv_codec + 0x4218) = ihevc_inter_pred_luma_vert_w16inp_ssse3;
  *(code **)((long)pv_codec + 0x4220) = ihevc_inter_pred_luma_copy_ssse3;
  *(code **)((long)pv_codec + 0x4228) = ihevc_inter_pred_luma_copy_w16out_ssse3;
  *(code **)((long)pv_codec + 0x4230) = ihevc_inter_pred_luma_horz_w16out_ssse3;
  *(code **)((long)pv_codec + 0x4238) = ihevc_inter_pred_luma_vert_w16inp_w16out_ssse3;
  *(code **)((long)pv_codec + 0x4240) = ihevc_intra_pred_chroma_ref_substitution;
  *(code **)((long)pv_codec + 0x4248) = ihevc_intra_pred_luma_ref_substitution;
  *(code **)((long)pv_codec + 0x4250) = ihevc_intra_pred_luma_ref_subst_all_avlble;
  *(code **)((long)pv_codec + 0x4258) = ihevc_intra_pred_ref_filtering_ssse3;
  *(code **)((long)pv_codec + 0x4260) = ihevc_intra_pred_chroma_dc_ssse3;
  *(code **)((long)pv_codec + 17000) = ihevc_intra_pred_chroma_horz_ssse3;
  *(code **)((long)pv_codec + 0x4270) = ihevc_intra_pred_chroma_mode2_ssse3;
  *(code **)((long)pv_codec + 0x4278) = ihevc_intra_pred_chroma_mode_18_34_ssse3;
  *(code **)((long)pv_codec + 0x4280) = ihevc_intra_pred_chroma_mode_27_to_33_ssse3;
  *(code **)((long)pv_codec + 0x4288) = ihevc_intra_pred_chroma_mode_3_to_9_ssse3;
  *(code **)((long)pv_codec + 0x4290) = ihevc_intra_pred_chroma_planar_ssse3;
  *(code **)((long)pv_codec + 0x4298) = ihevc_intra_pred_chroma_ver_ssse3;
  *(code **)((long)pv_codec + 0x42a0) = ihevc_intra_pred_chroma_mode_11_to_17_ssse3;
  *(code **)((long)pv_codec + 0x42a8) = ihevc_intra_pred_chroma_mode_19_to_25_ssse3;
  *(code **)((long)pv_codec + 0x42b0) = ihevc_intra_pred_luma_mode_11_to_17_ssse3;
  *(code **)((long)pv_codec + 0x42b8) = ihevc_intra_pred_luma_mode_19_to_25_ssse3;
  *(code **)((long)pv_codec + 0x42c0) = ihevc_intra_pred_luma_dc_ssse3;
  *(code **)((long)pv_codec + 0x42c8) = ihevc_intra_pred_luma_horz_ssse3;
  *(code **)((long)pv_codec + 0x42d0) = ihevc_intra_pred_luma_mode2_ssse3;
  *(code **)((long)pv_codec + 0x42d8) = ihevc_intra_pred_luma_mode_18_34_ssse3;
  *(code **)((long)pv_codec + 0x42e0) = ihevc_intra_pred_luma_mode_27_to_33_ssse3;
  *(code **)((long)pv_codec + 0x42e8) = ihevc_intra_pred_luma_mode_3_to_9_ssse3;
  *(code **)((long)pv_codec + 0x42f0) = ihevc_intra_pred_luma_planar_ssse3;
  *(code **)((long)pv_codec + 0x42f8) = ihevc_intra_pred_luma_ver_ssse3;
  *(code **)((long)pv_codec + 0x4300) = ihevc_itrans_4x4_ttype1;
  *(code **)((long)pv_codec + 0x4308) = ihevc_itrans_4x4;
  *(code **)((long)pv_codec + 0x4310) = ihevc_itrans_8x8;
  *(code **)((long)pv_codec + 0x4318) = ihevc_itrans_16x16;
  *(code **)((long)pv_codec + 0x4320) = ihevc_itrans_32x32;
  *(code **)((long)pv_codec + 0x4328) = ihevc_itrans_recon_4x4_ttype1_ssse3;
  *(code **)((long)pv_codec + 0x4330) = ihevc_itrans_recon_4x4_ssse3;
  *(code **)((long)pv_codec + 0x4338) = ihevc_itrans_recon_8x8_ssse3;
  *(code **)((long)pv_codec + 0x4340) = ihevc_itrans_recon_16x16_ssse3;
  *(code **)((long)pv_codec + 0x4348) = ihevc_itrans_recon_32x32_ssse3;
  *(code **)((long)pv_codec + 0x4350) = ihevc_chroma_itrans_recon_4x4;
  *(code **)((long)pv_codec + 0x4358) = ihevc_chroma_itrans_recon_8x8;
  *(code **)((long)pv_codec + 0x4360) = ihevc_chroma_itrans_recon_16x16;
  *(code **)((long)pv_codec + 0x4368) = ihevc_recon_4x4_ttype1;
  *(code **)((long)pv_codec + 0x4370) = ihevc_recon_4x4;
  *(code **)((long)pv_codec + 0x4378) = ihevc_recon_8x8;
  *(code **)((long)pv_codec + 0x4380) = ihevc_recon_16x16;
  *(code **)((long)pv_codec + 0x4388) = ihevc_recon_32x32;
  *(code **)((long)pv_codec + 0x4390) = ihevc_chroma_recon_4x4;
  *(code **)((long)pv_codec + 0x4398) = ihevc_chroma_recon_8x8;
  *(code **)((long)pv_codec + 0x43a0) = ihevc_chroma_recon_16x16;
  *(code **)((long)pv_codec + 0x43a8) = ihevc_memcpy_mul_8;
  *(code **)((long)pv_codec + 0x43b0) = ihevc_memcpy;
  *(code **)((long)pv_codec + 0x43b8) = ihevc_memset_mul_8;
  *(code **)((long)pv_codec + 0x43c0) = ihevc_memset;
  *(code **)((long)pv_codec + 0x43c8) = ihevc_memset_16bit_mul_8;
  *(code **)((long)pv_codec + 0x43d0) = ihevc_memset_16bit;
  *(code **)((long)pv_codec + 0x43d8) = ihevc_pad_left_luma;
  *(code **)((long)pv_codec + 0x43e0) = ihevc_pad_left_chroma;
  *(code **)((long)pv_codec + 0x43e8) = ihevc_pad_right_luma;
  *(code **)((long)pv_codec + 0x43f0) = ihevc_pad_right_chroma;
  *(code **)((long)pv_codec + 0x43f8) = ihevc_weighted_pred_bi_ssse3;
  *(code **)((long)pv_codec + 0x4400) = ihevc_weighted_pred_bi_default_ssse3;
  *(code **)((long)pv_codec + 0x4408) = ihevc_weighted_pred_uni_ssse3;
  *(code **)((long)pv_codec + 0x4410) = ihevc_weighted_pred_chroma_bi_ssse3;
  *(code **)((long)pv_codec + 0x4418) = ihevc_weighted_pred_chroma_bi_default_ssse3;
  *(code **)((long)pv_codec + 0x4420) = ihevc_weighted_pred_chroma_uni_ssse3;
  *(code **)((long)pv_codec + 0x4428) = ihevc_sao_band_offset_luma_ssse3;
  *(code **)((long)pv_codec + 0x4430) = ihevc_sao_band_offset_chroma_ssse3;
  *(code **)((long)pv_codec + 0x4438) = ihevc_sao_edge_offset_class0_ssse3;
  *(code **)((long)pv_codec + 0x4440) = ihevc_sao_edge_offset_class0_chroma_ssse3;
  *(code **)((long)pv_codec + 0x4448) = ihevc_sao_edge_offset_class1_ssse3;
  *(code **)((long)pv_codec + 0x4450) = ihevc_sao_edge_offset_class1_chroma_ssse3;
  *(code **)((long)pv_codec + 0x4458) = ihevc_sao_edge_offset_class2_ssse3;
  *(code **)((long)pv_codec + 0x4460) = ihevc_sao_edge_offset_class2_chroma_ssse3;
  *(code **)((long)pv_codec + 0x4468) = ihevc_sao_edge_offset_class3_ssse3;
  *(code **)((long)pv_codec + 0x4470) = ihevc_sao_edge_offset_class3_chroma_ssse3;
  *(code **)((long)pv_codec + 0x4478) = ihevcd_fmt_conv_420sp_to_rgba8888;
  *(code **)((long)pv_codec + 0x4480) = ihevcd_fmt_conv_420sp_to_rgb565;
  *(code **)((long)pv_codec + 0x4488) = ihevcd_fmt_conv_420sp_to_420sp;
  *(code **)((long)pv_codec + 0x4490) = ihevcd_fmt_conv_420sp_to_420p;
  *(code **)((long)pv_codec + 0x4498) = ihevcd_itrans_recon_dc_luma_ssse3;
  *(code **)((long)pv_codec + 0x44a0) = ihevcd_itrans_recon_dc_chroma_ssse3;
  return;
}

Assistant:

void ihevcd_init_function_ptr_ssse3(void *pv_codec)
{
    codec_t *ps_codec = (codec_t *)pv_codec;

    ps_codec->s_func_selector.ihevc_deblk_chroma_horz_fptr                      =  &ihevc_deblk_chroma_horz_ssse3;
    ps_codec->s_func_selector.ihevc_deblk_chroma_vert_fptr                      =  &ihevc_deblk_chroma_vert_ssse3;
    ps_codec->s_func_selector.ihevc_deblk_luma_vert_fptr                        =  &ihevc_deblk_luma_vert_ssse3;
    ps_codec->s_func_selector.ihevc_deblk_luma_horz_fptr                        =  &ihevc_deblk_luma_horz_ssse3;
    ps_codec->s_func_selector.ihevc_inter_pred_chroma_copy_fptr                 =  &ihevc_inter_pred_chroma_copy_ssse3;
    ps_codec->s_func_selector.ihevc_inter_pred_chroma_copy_w16out_fptr          =  &ihevc_inter_pred_chroma_copy_w16out_ssse3;
    ps_codec->s_func_selector.ihevc_inter_pred_chroma_horz_fptr                 =  &ihevc_inter_pred_chroma_horz_ssse3;
    ps_codec->s_func_selector.ihevc_inter_pred_chroma_horz_w16out_fptr          =  &ihevc_inter_pred_chroma_horz_w16out_ssse3;
    ps_codec->s_func_selector.ihevc_inter_pred_chroma_vert_fptr                 =  &ihevc_inter_pred_chroma_vert_ssse3;
    ps_codec->s_func_selector.ihevc_inter_pred_chroma_vert_w16inp_fptr          =  &ihevc_inter_pred_chroma_vert_w16inp_ssse3;
    ps_codec->s_func_selector.ihevc_inter_pred_chroma_vert_w16inp_w16out_fptr   =  &ihevc_inter_pred_chroma_vert_w16inp_w16out_ssse3;
    ps_codec->s_func_selector.ihevc_inter_pred_chroma_vert_w16out_fptr          =  &ihevc_inter_pred_chroma_vert_w16out_ssse3;
    ps_codec->s_func_selector.ihevc_inter_pred_luma_horz_fptr                   =  &ihevc_inter_pred_luma_horz_ssse3;
    ps_codec->s_func_selector.ihevc_inter_pred_luma_vert_fptr                   =  &ihevc_inter_pred_luma_vert_ssse3;
    ps_codec->s_func_selector.ihevc_inter_pred_luma_vert_w16out_fptr            =  &ihevc_inter_pred_luma_vert_w16out_ssse3;
    ps_codec->s_func_selector.ihevc_inter_pred_luma_vert_w16inp_fptr            =  &ihevc_inter_pred_luma_vert_w16inp_ssse3;
    ps_codec->s_func_selector.ihevc_inter_pred_luma_copy_fptr                   =  &ihevc_inter_pred_luma_copy_ssse3;
    ps_codec->s_func_selector.ihevc_inter_pred_luma_copy_w16out_fptr            =  &ihevc_inter_pred_luma_copy_w16out_ssse3;
    ps_codec->s_func_selector.ihevc_inter_pred_luma_horz_w16out_fptr            =  &ihevc_inter_pred_luma_horz_w16out_ssse3;
    ps_codec->s_func_selector.ihevc_inter_pred_luma_vert_w16inp_w16out_fptr     =  &ihevc_inter_pred_luma_vert_w16inp_w16out_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_chroma_ref_substitution_fptr     =  &ihevc_intra_pred_chroma_ref_substitution;
    ps_codec->s_func_selector.ihevc_intra_pred_luma_ref_substitution_fptr       =  &ihevc_intra_pred_luma_ref_substitution;
    ps_codec->s_func_selector.ihevc_intra_pred_luma_ref_subst_all_avlble_fptr   =  &ihevc_intra_pred_luma_ref_subst_all_avlble;
    ps_codec->s_func_selector.ihevc_intra_pred_ref_filtering_fptr               =  &ihevc_intra_pred_ref_filtering_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_chroma_dc_fptr                   =  &ihevc_intra_pred_chroma_dc_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_chroma_horz_fptr                 =  &ihevc_intra_pred_chroma_horz_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_chroma_mode2_fptr                =  &ihevc_intra_pred_chroma_mode2_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_chroma_mode_18_34_fptr           =  &ihevc_intra_pred_chroma_mode_18_34_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_chroma_mode_27_to_33_fptr        =  &ihevc_intra_pred_chroma_mode_27_to_33_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_chroma_mode_3_to_9_fptr          =  &ihevc_intra_pred_chroma_mode_3_to_9_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_chroma_planar_fptr               =  &ihevc_intra_pred_chroma_planar_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_chroma_ver_fptr                  =  &ihevc_intra_pred_chroma_ver_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_chroma_mode_11_to_17_fptr        =  &ihevc_intra_pred_chroma_mode_11_to_17_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_chroma_mode_19_to_25_fptr        =  &ihevc_intra_pred_chroma_mode_19_to_25_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_luma_mode_11_to_17_fptr          =  &ihevc_intra_pred_luma_mode_11_to_17_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_luma_mode_19_to_25_fptr          =  &ihevc_intra_pred_luma_mode_19_to_25_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_luma_dc_fptr                     =  &ihevc_intra_pred_luma_dc_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_luma_horz_fptr                   =  &ihevc_intra_pred_luma_horz_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_luma_mode2_fptr                  =  &ihevc_intra_pred_luma_mode2_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_luma_mode_18_34_fptr             =  &ihevc_intra_pred_luma_mode_18_34_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_luma_mode_27_to_33_fptr          =  &ihevc_intra_pred_luma_mode_27_to_33_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_luma_mode_3_to_9_fptr            =  &ihevc_intra_pred_luma_mode_3_to_9_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_luma_planar_fptr                 =  &ihevc_intra_pred_luma_planar_ssse3;
    ps_codec->s_func_selector.ihevc_intra_pred_luma_ver_fptr                    =  &ihevc_intra_pred_luma_ver_ssse3;
    ps_codec->s_func_selector.ihevc_itrans_4x4_ttype1_fptr                      =  &ihevc_itrans_4x4_ttype1;
    ps_codec->s_func_selector.ihevc_itrans_4x4_fptr                             =  &ihevc_itrans_4x4;
    ps_codec->s_func_selector.ihevc_itrans_8x8_fptr                             =  &ihevc_itrans_8x8;
    ps_codec->s_func_selector.ihevc_itrans_16x16_fptr                           =  &ihevc_itrans_16x16;
    ps_codec->s_func_selector.ihevc_itrans_32x32_fptr                           =  &ihevc_itrans_32x32;
    ps_codec->s_func_selector.ihevc_itrans_recon_4x4_ttype1_fptr                =  &ihevc_itrans_recon_4x4_ttype1_ssse3;
    ps_codec->s_func_selector.ihevc_itrans_recon_4x4_fptr                       =  &ihevc_itrans_recon_4x4_ssse3;
    ps_codec->s_func_selector.ihevc_itrans_recon_8x8_fptr                       =  &ihevc_itrans_recon_8x8_ssse3;
    ps_codec->s_func_selector.ihevc_itrans_recon_16x16_fptr                     =  &ihevc_itrans_recon_16x16_ssse3;
    ps_codec->s_func_selector.ihevc_itrans_recon_32x32_fptr                     =  &ihevc_itrans_recon_32x32_ssse3;
    ps_codec->s_func_selector.ihevc_chroma_itrans_recon_4x4_fptr                =  &ihevc_chroma_itrans_recon_4x4;
    ps_codec->s_func_selector.ihevc_chroma_itrans_recon_8x8_fptr                =  &ihevc_chroma_itrans_recon_8x8;
    ps_codec->s_func_selector.ihevc_chroma_itrans_recon_16x16_fptr              =  &ihevc_chroma_itrans_recon_16x16;
    ps_codec->s_func_selector.ihevc_recon_4x4_ttype1_fptr                       =  &ihevc_recon_4x4_ttype1;
    ps_codec->s_func_selector.ihevc_recon_4x4_fptr                              =  &ihevc_recon_4x4;
    ps_codec->s_func_selector.ihevc_recon_8x8_fptr                              =  &ihevc_recon_8x8;
    ps_codec->s_func_selector.ihevc_recon_16x16_fptr                            =  &ihevc_recon_16x16;
    ps_codec->s_func_selector.ihevc_recon_32x32_fptr                            =  &ihevc_recon_32x32;
    ps_codec->s_func_selector.ihevc_chroma_recon_4x4_fptr                       =  &ihevc_chroma_recon_4x4;
    ps_codec->s_func_selector.ihevc_chroma_recon_8x8_fptr                       =  &ihevc_chroma_recon_8x8;
    ps_codec->s_func_selector.ihevc_chroma_recon_16x16_fptr                     =  &ihevc_chroma_recon_16x16;
    ps_codec->s_func_selector.ihevc_memcpy_mul_8_fptr                           =  &ihevc_memcpy_mul_8;
    ps_codec->s_func_selector.ihevc_memcpy_fptr                                 =  &ihevc_memcpy;
    ps_codec->s_func_selector.ihevc_memset_mul_8_fptr                           =  &ihevc_memset_mul_8;
    ps_codec->s_func_selector.ihevc_memset_fptr                                 =  &ihevc_memset;
    ps_codec->s_func_selector.ihevc_memset_16bit_mul_8_fptr                     =  &ihevc_memset_16bit_mul_8;
    ps_codec->s_func_selector.ihevc_memset_16bit_fptr                           =  &ihevc_memset_16bit;
    ps_codec->s_func_selector.ihevc_pad_left_luma_fptr                          =  &ihevc_pad_left_luma;
    ps_codec->s_func_selector.ihevc_pad_left_chroma_fptr                        =  &ihevc_pad_left_chroma;
    ps_codec->s_func_selector.ihevc_pad_right_luma_fptr                         =  &ihevc_pad_right_luma;
    ps_codec->s_func_selector.ihevc_pad_right_chroma_fptr                       =  &ihevc_pad_right_chroma;
    ps_codec->s_func_selector.ihevc_weighted_pred_bi_fptr                       =  &ihevc_weighted_pred_bi_ssse3;
    ps_codec->s_func_selector.ihevc_weighted_pred_bi_default_fptr               =  &ihevc_weighted_pred_bi_default_ssse3;
    ps_codec->s_func_selector.ihevc_weighted_pred_uni_fptr                      =  &ihevc_weighted_pred_uni_ssse3;
    ps_codec->s_func_selector.ihevc_weighted_pred_chroma_bi_fptr                =  &ihevc_weighted_pred_chroma_bi_ssse3;
    ps_codec->s_func_selector.ihevc_weighted_pred_chroma_bi_default_fptr        =  &ihevc_weighted_pred_chroma_bi_default_ssse3;
    ps_codec->s_func_selector.ihevc_weighted_pred_chroma_uni_fptr               =  &ihevc_weighted_pred_chroma_uni_ssse3;
    ps_codec->s_func_selector.ihevc_sao_band_offset_luma_fptr                   =  &ihevc_sao_band_offset_luma_ssse3;
    ps_codec->s_func_selector.ihevc_sao_band_offset_chroma_fptr                 =  &ihevc_sao_band_offset_chroma_ssse3;
    ps_codec->s_func_selector.ihevc_sao_edge_offset_class0_fptr                 =  &ihevc_sao_edge_offset_class0_ssse3;
    ps_codec->s_func_selector.ihevc_sao_edge_offset_class0_chroma_fptr          =  &ihevc_sao_edge_offset_class0_chroma_ssse3;
    ps_codec->s_func_selector.ihevc_sao_edge_offset_class1_fptr                 =  &ihevc_sao_edge_offset_class1_ssse3;
    ps_codec->s_func_selector.ihevc_sao_edge_offset_class1_chroma_fptr          =  &ihevc_sao_edge_offset_class1_chroma_ssse3;
    ps_codec->s_func_selector.ihevc_sao_edge_offset_class2_fptr                 =  &ihevc_sao_edge_offset_class2_ssse3;
    ps_codec->s_func_selector.ihevc_sao_edge_offset_class2_chroma_fptr          =  &ihevc_sao_edge_offset_class2_chroma_ssse3;
    ps_codec->s_func_selector.ihevc_sao_edge_offset_class3_fptr                 =  &ihevc_sao_edge_offset_class3_ssse3;
    ps_codec->s_func_selector.ihevc_sao_edge_offset_class3_chroma_fptr          =  &ihevc_sao_edge_offset_class3_chroma_ssse3;
    ps_codec->s_func_selector.ihevcd_fmt_conv_420sp_to_rgba8888_fptr            =  &ihevcd_fmt_conv_420sp_to_rgba8888;
    ps_codec->s_func_selector.ihevcd_fmt_conv_420sp_to_rgb565_fptr              =  &ihevcd_fmt_conv_420sp_to_rgb565;
    ps_codec->s_func_selector.ihevcd_fmt_conv_420sp_to_420sp_fptr               =  &ihevcd_fmt_conv_420sp_to_420sp;
    ps_codec->s_func_selector.ihevcd_fmt_conv_420sp_to_420p_fptr                =  &ihevcd_fmt_conv_420sp_to_420p;
    ps_codec->s_func_selector.ihevcd_itrans_recon_dc_luma_fptr                  =  &ihevcd_itrans_recon_dc_luma_ssse3;
    ps_codec->s_func_selector.ihevcd_itrans_recon_dc_chroma_fptr                =  &ihevcd_itrans_recon_dc_chroma_ssse3;
}